

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O0

bool __thiscall
ON_HistoryRecord::SetObjRefValues(ON_HistoryRecord *this,int value_id,int count,ON_ObjRef *oref)

{
  bool bVar1;
  ON_UUID uuid;
  bool bVar2;
  int iVar3;
  ON_Value *pOVar4;
  ON_ObjRef *pOVar5;
  ON_ObjRef_IRefID *pOVar6;
  int local_74;
  int r;
  ON_ObjRef_IRefID *iref;
  undefined1 local_48 [8];
  ON_UUID object_id;
  ON_ObjRef *vor;
  int i;
  bool idef_geometry;
  ON_ObjRefValue *v;
  ON_ObjRef *oref_local;
  int count_local;
  int value_id_local;
  ON_HistoryRecord *this_local;
  
  pOVar4 = FindValueHelper(this,value_id,9,true);
  if (pOVar4 != (ON_Value *)0x0) {
    ON_ClassArray<ON_ObjRef>::Destroy((ON_ClassArray<ON_ObjRef> *)(pOVar4 + 1));
    ON_ClassArray<ON_ObjRef>::Reserve((ON_ClassArray<ON_ObjRef> *)(pOVar4 + 1),(long)count);
    if (count != 0) {
      bVar1 = false;
      if (oref != (ON_ObjRef *)0x0) {
        iVar3 = ON_SimpleArray<ON_ObjRef_IRefID>::Count(&oref->m__iref);
        bVar1 = 0 < iVar3;
      }
      for (vor._0_4_ = 0; (int)vor < count; vor._0_4_ = (int)vor + 1) {
        object_id.Data4 =
             (uchar  [8])
             ON_ClassArray<ON_ObjRef>::AppendNew((ON_ClassArray<ON_ObjRef> *)(pOVar4 + 1));
        ON_ObjRef::operator=((ON_ObjRef *)object_id.Data4,oref + (int)vor);
        ON_ObjRef::DecrementProxyReferenceCount((ON_ObjRef *)object_id.Data4);
        *(undefined4 *)((long)object_id.Data4 + 0x2c) = 0;
        if (!bVar1) {
          pOVar5 = ON_ClassArray<ON_ObjRef>::operator[]
                             ((ON_ClassArray<ON_ObjRef> *)(pOVar4 + 1),(int)vor);
          local_48._0_4_ = (pOVar5->m_uuid).Data1;
          local_48._4_2_ = (pOVar5->m_uuid).Data2;
          local_48._6_2_ = (pOVar5->m_uuid).Data3;
          object_id._0_8_ = *(undefined8 *)(pOVar5->m_uuid).Data4;
          bVar2 = ON_UuidIsNil((ON_UUID *)local_48);
          if (!bVar2) {
            uuid.Data4 = (uchar  [8])object_id._0_8_;
            uuid.Data1 = local_48._0_4_;
            uuid.Data2 = local_48._4_2_;
            uuid.Data3 = local_48._6_2_;
            ON_UuidList::AddUuid(&this->m_antecedents,uuid,true);
          }
        }
      }
      if (bVar1) {
        pOVar6 = ON_SimpleArray<ON_ObjRef_IRefID>::Last(&oref->m__iref);
        if (pOVar6 != (ON_ObjRef_IRefID *)0x0) {
          ON_UuidList::AddUuid(&this->m_antecedents,pOVar6->m_iref_uuid,true);
        }
        for (local_74 = 0; iVar3 = ON_SimpleArray<ON_ObjRef_IRefID>::Count(&oref->m__iref),
            local_74 < iVar3; local_74 = local_74 + 1) {
          pOVar6 = ON_SimpleArray<ON_ObjRef_IRefID>::operator[](&oref->m__iref,local_74);
          ON_UuidList::AddUuid(&this->m_antecedents,pOVar6->m_idef_uuid,true);
        }
      }
    }
  }
  return pOVar4 != (ON_Value *)0x0;
}

Assistant:

bool ON_HistoryRecord::SetObjRefValues( int value_id, int count, const ON_ObjRef* oref)
{
  ON_ObjRefValue* v = static_cast<ON_ObjRefValue*>(FindValueHelper(value_id,ON_Value::objref_value,true));
  if ( v )
  {
    v->m_value.Destroy();
    v->m_value.Reserve(count);

    if(count)
    {
      // 2019-01-23 - kike@mcneel.com
      // Objects in instance definitions can not be modified in that case
      // I add the root instance reference and all the instance definitions as 'antecedents'
      const bool idef_geometry = oref && (oref->m__iref.Count() > 0);

      for(int i = 0; i < count; i++)
      {
        // The call to DecrementProxyReferenceCount() is critical.
        // It makes sure there are no active runtime pointers 
        // saved in the history record.  If this call is not here,
        // you will eventually crash and history update will never
        // work right even when it doesn't crash.
        ON_ObjRef& vor = v->m_value.AppendNew();
        vor = oref[i];
        vor.DecrementProxyReferenceCount();
        // Feb 12 2010 - Fixing bug in ExtrudeCrv history
        //  and probably lots of other subtle history bugs.
        //  History must lookup by UUID and not by runtime serial number.
        vor.m_runtime_sn = 0;

        // 2019-01-23 - kike@mcneel.com
        if(!idef_geometry)
        {
          ON_UUID object_id = v->m_value[i].m_uuid;
          if(!ON_UuidIsNil(object_id))
          {
            m_antecedents.AddUuid(object_id);
          }
        }
      }

      // 2019-01-23 - kike@mcneel.com
      if(idef_geometry)
      {
        if(auto iref = oref->m__iref.Last())
          m_antecedents.AddUuid(iref->m_iref_uuid);

        for(int r = 0; r < oref->m__iref.Count(); ++r)
          m_antecedents.AddUuid(oref->m__iref[r].m_idef_uuid);
      }
    }
  }
  return (0 != v);
}